

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::A_formatter<spdlog::details::null_scoped_padder>::format
          (A_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char *__s;
  size_t __n;
  ulong uVar1;
  char *buf_ptr;
  ptrdiff_t _Num;
  
  __s = *(char **)(full_days + (long)tm_time->tm_wday * 8);
  __n = strlen(__s);
  if (__s != (char *)0x0) {
    uVar1 = (dest->super_buffer<char>).size_ + __n;
    if ((dest->super_buffer<char>).capacity_ < uVar1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar1);
    }
    if (__n != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__s,__n);
    }
    (dest->super_buffer<char>).size_ = uVar1;
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        string_view_t field_value{full_days[static_cast<size_t>(tm_time.tm_wday)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }